

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t *this;
  size_t *this_00;
  size_t *this_01;
  pointer *this_02;
  pointer *this_03;
  bool bVar1;
  ostream *poVar2;
  reference this_04;
  string local_9e0;
  reference local_9c0;
  ArrayInfo *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ArrayInfo,_std::allocator<ArrayInfo>_> *__range1_1;
  string local_980;
  reference local_960;
  SymbolTableElement *j;
  iterator __end2;
  iterator __begin2;
  vector<SymbolTableElement,_std::allocator<SymbolTableElement>_> *__range2;
  vector<SymbolTableElement,_std::allocator<SymbolTableElement>_> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
  *__range1;
  ofstream out;
  int local_71c;
  int cur;
  int index;
  string local_6f8;
  vector<QuadTuple,_std::allocator<QuadTuple>_> local_6d8;
  string local_6c0;
  undefined1 local_6a0 [8];
  Parse parse;
  string local_3c8;
  undefined1 local_3a8 [8];
  Scanner sc;
  vector<QuadTuple,_std::allocator<QuadTuple>_> quadVec;
  vector<Token,_std::allocator<Token>_> tokenVec;
  StringTable stringTable;
  CharTable charTable;
  FloatTable floatTable;
  IntTable intTable;
  DelimiterTable delimiterTable;
  IdentiferTable identiferTable;
  KeyWordTable keyWordTable;
  string local_128 [8];
  string outputTableDir;
  string outputInstDir;
  string outputDAGDir;
  string local_c0 [8];
  string outputAsmDir;
  string local_98 [8];
  string outputQuadDir;
  string local_70 [8];
  string outputLexDir;
  allocator local_39;
  string local_38 [8];
  string srcfileName;
  char **argv_local;
  int argc_local;
  
  srcfileName.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"../src.txt",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"../lex.txt",(allocator *)(outputQuadDir.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(outputQuadDir.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"../quad.txt",(allocator *)(outputAsmDir.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(outputAsmDir.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"../asm.txt",(allocator *)(outputDAGDir.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(outputDAGDir.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(outputInstDir.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(outputTableDir.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_128);
  if (argc == 0xc) {
    std::__cxx11::string::operator=(local_38,*(char **)(srcfileName.field_2._8_8_ + 8));
    std::__cxx11::string::operator=(local_70,*(char **)(srcfileName.field_2._8_8_ + 0x18));
    std::__cxx11::string::operator=(local_98,*(char **)(srcfileName.field_2._8_8_ + 0x28));
    std::__cxx11::string::operator=
              ((string *)(outputInstDir.field_2._M_local_buf + 8),
               *(char **)(srcfileName.field_2._8_8_ + 0x38));
    std::__cxx11::string::operator=
              ((string *)(outputTableDir.field_2._M_local_buf + 8),
               *(char **)(srcfileName.field_2._8_8_ + 0x48));
    std::__cxx11::string::operator=(local_128,*(char **)(srcfileName.field_2._8_8_ + 0x58));
    poVar2 = std::operator<<((ostream *)&std::cout,"srcpath: ");
    poVar2 = std::operator<<(poVar2,local_38);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"lexPath: ");
    poVar2 = std::operator<<(poVar2,local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"quadPath: ");
    poVar2 = std::operator<<(poVar2,local_98);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"targetpath: ");
    poVar2 = std::operator<<(poVar2,local_c0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"outputDAGDir: ");
    poVar2 = std::operator<<(poVar2,(string *)(outputInstDir.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"outputInstDir: ");
    poVar2 = std::operator<<(poVar2,(string *)(outputTableDir.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    KeyWordTable::KeyWordTable
              ((KeyWordTable *)
               &identiferTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .index._M_t._M_impl.super__Rb_tree_header._M_node_count);
    IdentiferTable::IdentiferTable
              ((IdentiferTable *)
               &delimiterTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .index._M_t._M_impl.super__Rb_tree_header._M_node_count);
    DelimiterTable::DelimiterTable
              ((DelimiterTable *)
               &intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this = &floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_node_count;
    IntTable::IntTable((IntTable *)this);
    this_00 = &charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_node_count;
    FloatTable::FloatTable((FloatTable *)this_00);
    this_01 = &stringTable.
               super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .index._M_t._M_impl.super__Rb_tree_header._M_node_count;
    CharTable::CharTable((CharTable *)this_01);
    this_02 = &tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    StringTable::StringTable((StringTable *)this_02);
    this_03 = &quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<Token,_std::allocator<Token>_>::vector
              ((vector<Token,_std::allocator<Token>_> *)this_03);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::vector
              ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)&sc.curLine);
    Scanner::Scanner((Scanner *)local_3a8,
                     (KeyWordTable *)
                     &identiferTable.
                      super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (IdentiferTable *)
                     &delimiterTable.
                      super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (DelimiterTable *)
                     &intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count,(IntTable *)this,(FloatTable *)this_00,(CharTable *)this_01,
                     (StringTable *)this_02,(vector<Token,_std::allocator<Token>_> *)this_03,
                     &symbolTable);
    std::__cxx11::string::string((string *)&local_3c8,local_38);
    Scanner::scan((Scanner *)local_3a8,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::string((string *)(parse.curTmpName.field_2._M_local_buf + 8),local_70);
    Scanner::showLex((Scanner *)local_3a8,(string *)((long)&parse.curTmpName.field_2 + 8));
    std::__cxx11::string::~string((string *)(parse.curTmpName.field_2._M_local_buf + 8));
    Parse::Parse((Parse *)local_6a0,(vector<QuadTuple,_std::allocator<QuadTuple>_> *)&sc.curLine,
                 (vector<Token,_std::allocator<Token>_> *)
                 &quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&symbolTable,
                 (KeyWordTable *)
                 &identiferTable.
                  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (IdentiferTable *)
                 &delimiterTable.
                  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (DelimiterTable *)
                 &intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (IntTable *)
                 &floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,
                 (FloatTable *)
                 &charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_node_count
                 ,(CharTable *)
                  &stringTable.
                   super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (StringTable *)
                 &tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    Parse::parse((Parse *)local_6a0);
    std::__cxx11::string::string((string *)&local_6c0,local_98);
    Parse::print((Parse *)local_6a0,&local_6c0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::vector
              (&local_6d8,(vector<QuadTuple,_std::allocator<QuadTuple>_> *)&sc.curLine);
    std::__cxx11::string::string
              ((string *)&local_6f8,(string *)(outputInstDir.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&cur,(string *)(outputTableDir.field_2._M_local_buf + 8))
    ;
    test(&local_6d8,&local_6f8,(string *)&cur);
    std::__cxx11::string::~string((string *)&cur);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::~vector(&local_6d8);
    local_71c = 0;
    std::ofstream::ofstream(&__range1);
    std::operator|(_S_out,_S_trunc);
    std::ofstream::open((string *)&__range1,(_Ios_Openmode)local_128);
    __end1 = std::
             vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
             ::begin(&symbolTable.symbolTable);
    i = (vector<SymbolTableElement,_std::allocator<SymbolTableElement>_> *)
        std::
        vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
        ::end(&symbolTable.symbolTable);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_*,_std::vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>_>
                                  *)&i);
      if (!bVar1) break;
      this_04 = __gnu_cxx::
                __normal_iterator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_*,_std::vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>_>
                ::operator*(&__end1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&__range1,local_71c);
      poVar2 = std::operator<<(poVar2,":");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __end2 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::begin(this_04);
      j = (SymbolTableElement *)
          std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::end(this_04);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<SymbolTableElement_*,_std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>
                                    *)&j);
        if (!bVar1) break;
        local_960 = __gnu_cxx::
                    __normal_iterator<SymbolTableElement_*,_std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>
                    ::operator*(&__end2);
        poVar2 = std::operator<<((ostream *)&__range1,(string *)local_960);
        poVar2 = std::operator<<(poVar2," ");
        Parse::toSymTypeName_abi_cxx11_(&local_980,(Parse *)local_6a0,&local_960->type);
        poVar2 = std::operator<<(poVar2,(string *)&local_980);
        poVar2 = std::operator<<(poVar2," ");
        Parse::toCatName_abi_cxx11_((string *)&__range1_1,(Parse *)local_6a0,local_960->cat);
        poVar2 = std::operator<<(poVar2,(string *)&__range1_1);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_960->vall);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&__range1_1);
        std::__cxx11::string::~string((string *)&local_980);
        __gnu_cxx::
        __normal_iterator<SymbolTableElement_*,_std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_*,_std::vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>_>
      ::operator++(&__end1);
      local_71c = local_71c + 1;
    }
    poVar2 = std::operator<<((ostream *)&__range1,anon_var_dwarf_42139);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&__range1,"Low ");
    poVar2 = std::operator<<(poVar2,"up ");
    poVar2 = std::operator<<(poVar2,"clen ");
    poVar2 = std::operator<<(poVar2,"type ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __end1_1 = std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>::begin(&symbolTable.arrayTableVec)
    ;
    i_1 = (ArrayInfo *)
          std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>::end(&symbolTable.arrayTableVec);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<ArrayInfo_*,_std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>_>
                          *)&i_1);
      if (!bVar1) break;
      local_9c0 = __gnu_cxx::
                  __normal_iterator<ArrayInfo_*,_std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>_>
                  ::operator*(&__end1_1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&__range1,local_9c0->low);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_9c0->up);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_9c0->clen);
      poVar2 = std::operator<<(poVar2," ");
      Parse::toSymTypeName_abi_cxx11_(&local_9e0,(Parse *)local_6a0,&local_9c0->type);
      poVar2 = std::operator<<(poVar2,(string *)&local_9e0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_9e0);
      __gnu_cxx::__normal_iterator<ArrayInfo_*,_std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>_>
      ::operator++(&__end1_1);
    }
    poVar2 = std::operator<<((ostream *)&__range1,anon_var_dwarf_4219a);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    std::ofstream::~ofstream(&__range1);
    Parse::~Parse((Parse *)local_6a0);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::~vector
              ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)&sc.curLine);
    std::vector<Token,_std::allocator<Token>_>::~vector
              ((vector<Token,_std::allocator<Token>_> *)
               &quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    StringTable::~StringTable
              ((StringTable *)
               &tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    CharTable::~CharTable
              ((CharTable *)
               &stringTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .index._M_t._M_impl.super__Rb_tree_header._M_node_count);
    FloatTable::~FloatTable
              ((FloatTable *)
               &charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_node_count);
    IntTable::~IntTable((IntTable *)
                        &floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count);
    DelimiterTable::~DelimiterTable
              ((DelimiterTable *)
               &intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_node_count);
    IdentiferTable::~IdentiferTable
              ((IdentiferTable *)
               &delimiterTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .index._M_t._M_impl.super__Rb_tree_header._M_node_count);
    KeyWordTable::~KeyWordTable
              ((KeyWordTable *)
               &identiferTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .index._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Invaild filename");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string((string *)(outputTableDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(outputInstDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    /*
     * 词法分析结果的输出
     */
    string srcfileName = "../src.txt";
    string outputLexDir = "../lex.txt";
    string outputQuadDir = "../quad.txt";
    string outputAsmDir = "../asm.txt";
    string outputDAGDir;
    string outputInstDir;
    string outputTableDir;
    if(argc != 12) {
        cout << "Invaild filename" << endl;
        return 0;
    } else {
        srcfileName = argv[1];
        outputLexDir = argv[3];
        outputQuadDir = argv[5];
        outputDAGDir = argv[7];
        outputInstDir = argv[9];
        outputTableDir = argv[11];
        cout << "srcpath: " << srcfileName << endl;
        cout << "lexPath: " << outputLexDir << endl;
        cout << "quadPath: " << outputQuadDir << endl;
        cout << "targetpath: " << outputAsmDir << endl;
        cout << "outputDAGDir: " << outputDAGDir << endl;
        cout << "outputInstDir: " << outputInstDir << endl;
    }
    KeyWordTable keyWordTable;
    IdentiferTable identiferTable;
    DelimiterTable delimiterTable;
    IntTable intTable;
    FloatTable floatTable;
    CharTable charTable;
    StringTable stringTable;
    vector<Token> tokenVec;
    vector<QuadTuple> quadVec;
    Scanner sc(keyWordTable, identiferTable, delimiterTable, intTable, floatTable, charTable, stringTable, tokenVec, symbolTable);
    sc.scan(srcfileName);
    sc.showLex(outputLexDir);
//    fclose(stdout);
//    cout << tokenVec.size() << endl;
    //symbolTable.print();
    /*
    Parse::Parse(vector<QuadTurple> &quadVec, vector<Token> &tokenVec, SymbolTable &st, KeyWordTable &kt,
                 IdentiferTable &it, DelimiterTable &dt, IntTable &inTable, FloatTable &ft, CharTable &ct,
                 StringTable &stTable) : quadVec(quadVec), tokenVec(tokenVec), st(st), keyWordTable(kt), identiferTable(it), delimiterTable(dt), intTable(inTable), floatTable(ft), charTable(ct), stringTable(stTable){
        this->curIndex = 0;
        this->curFun = -1;
        this->funCnt = 0;
    }
    */
    Parse parse(quadVec, tokenVec, symbolTable, keyWordTable, identiferTable, delimiterTable, intTable, floatTable, charTable, stringTable);
    parse.parse();
    parse.print(outputQuadDir);
    test(quadVec, outputDAGDir, outputInstDir);
    //symbolTable.print();
    int index = 0;
    int cur;
    ofstream out;
    out.open(outputTableDir, ios::out | ios::trunc);
    for (auto &i : symbolTable.symbolTable) {
        out << index++  << ":" << endl;
        cur = 0;
        for (auto &j : i) {
            out  << j.name << " " << parse.toSymTypeName(j.type) <<  " " <<  parse.toCatName(j.cat) << " " << j.vall<< endl;
        }
    }
    out << "数组表" << endl;
    out << "Low " <<"up " << "clen " << "type " << endl;
    for (auto &i : symbolTable.arrayTableVec) {
        out << i.low << " " << i.up << " " << i.clen << " " << parse.toSymTypeName(i.type) << endl;
    }


    out << "函数表" << endl;
//    out << "Low " <<"up " << "clen " << "type " << endl;
//    for (auto &i : symbolTable.functionTableVec) {
//        out << i.paramNum << " " << i. << " " << i.clen << " " << parse.toSymTypeName(i.type) << endl;
//    }
    out.close();
//    test(quadVec);
    //cout << symbolTable.isTempName("t5", "main") << endl;
//    cout << symbolTable.getAddr("a", "main").first << " " << symbolTable.getAddr("a", "main").second << endl;
    return 0;
}